

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

bool EV_MovePoly(line_t_conflict *line,int polyNum,double speed,DAngle *angle,double dist,
                bool overRide)

{
  bool bVar1;
  FPolyObj *pFVar2;
  size_t len;
  TVector2<double> local_218 [2];
  undefined1 local_1f8 [8];
  FPolyMirrorIterator it;
  DAngle an;
  FPolyObj *poly;
  DMovePoly *pe;
  bool overRide_local;
  double dist_local;
  DAngle *angle_local;
  double speed_local;
  int polyNum_local;
  line_t_conflict *line_local;
  
  poly = (FPolyObj *)0x0;
  TAngle<double>::TAngle((TAngle<double> *)&it.NumUsedPolys,angle);
  pFVar2 = PO_GetPolyobj(polyNum);
  if (pFVar2 == (FPolyObj *)0x0) {
    Printf("EV_MovePoly: Invalid polyobj num: %d\n",(ulong)(uint)polyNum);
    line_local._7_1_ = false;
  }
  else {
    FPolyMirrorIterator::FPolyMirrorIterator((FPolyMirrorIterator *)local_1f8,pFVar2);
    while (pFVar2 = FPolyMirrorIterator::NextMirror((FPolyMirrorIterator *)local_1f8),
          pFVar2 != (FPolyObj *)0x0) {
      len = 0;
      bVar1 = TObjPtr<DPolyAction>::operator!=(&pFVar2->specialdata,(DPolyAction *)0x0);
      if (((bVar1) || ((pFVar2->bBlocked & 1U) != 0)) && (!overRide)) break;
      poly = (FPolyObj *)DObject::operator_new((DObject *)0x70,len);
      DMovePoly::DMovePoly((DMovePoly *)poly,pFVar2->tag);
      TObjPtr<DPolyAction>::operator=(&pFVar2->specialdata,(DPolyAction *)poly);
      pFVar2->bBlocked = false;
      *(double *)&(poly->PrevPts).Most = dist;
      (poly->PrevPts).Array = (FPolyVertex *)speed;
      TAngle<double>::operator=
                ((TAngle<double> *)
                 ((anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1 *)&(poly->StartSpot).pos +
                 1),angle);
      TAngle<double>::ToVector((TAngle<double> *)local_218,speed);
      TVector2<double>::operator=(&(poly->CenterSpot).pos,local_218);
      SN_StartSequence(pFVar2,pFVar2->seqType,SEQ_DOOR,0,false);
      if (dist / speed <= 2.0) {
        DPolyAction::StopInterpolation((DPolyAction *)poly);
      }
      TAngle<double>::operator+=(angle,180.0);
    }
    line_local._7_1_ = poly != (FPolyObj *)0x0;
  }
  return line_local._7_1_;
}

Assistant:

bool EV_MovePoly (line_t *line, int polyNum, double speed, DAngle angle,
				  double dist, bool overRide)
{
	DMovePoly *pe = NULL;
	FPolyObj *poly;
	DAngle an = angle;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_MovePoly: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		pe = new DMovePoly(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		pe->m_Dist = dist; // Distance
		pe->m_Speed = speed;
		pe->m_Angle = angle;
		pe->m_Speedv = angle.ToVector(speed);
		SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);

		// Do not interpolate very fast moving polyobjects. The minimum tic count is
		// 3 instead of 2, because the moving crate effect in Massmouth 2, Hostitality
		// that this fixes isn't quite fast enough to move the crate back to its start
		// in just 1 tic.
		if (dist/speed <= 2)
		{
			pe->StopInterpolation ();
		}

		angle += 180.;	// Reverse the angle.
	}
	return pe != NULL;	// Return true if something started moving.
}